

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmsh_file_v4_binary.cc
# Opt level: O3

void __thiscall
lf::io::(anonymous_namespace)::
MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>::
MshV4GrammarBinary<boost::spirit::terminal<boost::spirit::tag::big_dword>,boost::spirit::terminal<boost::spirit::tag::big_qword>,boost::spirit::terminal<boost::spirit::tag::big_bin_double>>
          (MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> *this,
          terminal<boost::spirit::tag::big_dword> *dword,
          terminal<boost::spirit::tag::big_qword> *qword,
          terminal<boost::spirit::tag::big_bin_double> *bin_double)

{
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<const_char_(&)[15]>_>_>,_0L>
  that;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<const_char_(&)[10]>_>_>,_0L>
  that_1;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<const_char_(&)[7]>_>_>,_0L>
  that_3;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<const_char_(&)[21]>_>_>,_0L>
  that_2;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::big_qword,_boost::fusion::vector<int>_>_>,_0L>
  that_5;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::big_qword,_boost::fusion::vector<int>_>_>,_0L>
  that_6;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<char>_>_>,_0L>
  that_4;
  _Alloc_hider _Var1;
  car_type local_360;
  undefined1 local_358 [16];
  car_type local_348;
  car_type local_340;
  undefined1 local_330 [16];
  function_buffer *local_320;
  MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> *local_318;
  function_buffer **local_310;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_308;
  function_buffer ***local_300;
  MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> *local_2f8;
  function_buffer ****local_2f0;
  MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> *local_2e8;
  MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> ******local_2e0
  ;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2d8;
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::locals<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
  *local_2d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2c8;
  undefined1 local_2c0 [16];
  undefined1 local_2b0 [16];
  undefined1 local_2a0 [16];
  function_buffer local_290;
  MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> *local_278;
  proto_child0 *local_270;
  proto_child0 local_268;
  vtable_base *local_260;
  undefined1 local_258 [24];
  vtable_base local_240;
  MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> *local_238;
  vtable_base local_230;
  MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> *local_228;
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::fusion::adapted::MshFileV4Adapted_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
  *local_220;
  MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> **local_218;
  function_buffer *local_210;
  MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> *local_208;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_200;
  proto_child0 local_1f0;
  MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> *local_1e8;
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::locals<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
  *local_1e0;
  MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> *local_1d8;
  MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> *local_1d0;
  MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> *local_1c8;
  MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> *local_1c0;
  MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> *local_1b8;
  MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> *local_1b0;
  MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> *local_1a8;
  reference_wrapper<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::locals<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
  local_1a0;
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_lf::io::GMshFileV4::PhysicalName_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
  *local_198;
  MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> *local_190;
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::locals<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
  *local_188;
  function_buffer *local_180;
  MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> *local_178;
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::locals<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
  *local_170;
  MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> *local_168;
  MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> *local_160;
  MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> *local_158;
  MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> *local_150;
  MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> *local_148;
  MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> *local_140;
  MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> *local_138;
  MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> *local_130;
  MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> *local_128;
  MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> *local_120;
  MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> *local_118;
  MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> *local_110;
  MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> *local_108;
  undefined1 local_f9 [6];
  undefined1 local_f3 [27];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  
  _Var1._M_p = local_358;
  std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xfffffffffffffc98,"Msh File","");
  local_220 = (rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::fusion::adapted::MshFileV4Adapted_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
               *)(this + 0x220);
  *(rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::fusion::adapted::MshFileV4Adapted_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
    **)this = local_220;
  *(MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> **)(this + 8)
       = this + 0x18;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(this + 8),_Var1._M_p,_Var1._M_p + (long)local_360.ref.t_);
  if (_Var1._M_p != local_358) {
    operator_delete(_Var1._M_p,local_358._0_8_ + 1);
  }
  _Var1._M_p = local_358;
  local_f3._3_8_ = (string *)(this + 8);
  local_f3._11_8_ = this + 0x18;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffffc98,"unnamed-rule","");
  local_108 = this + 0x28;
  *(MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> **)
   (this + 0x28) = local_108;
  *(MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> **)
   (this + 0x30) = this + 0x40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(this + 0x30),_Var1._M_p,_Var1._M_p + (long)local_360.ref.t_);
  *(undefined8 *)(this + 0x50) = 0;
  if (_Var1._M_p != local_358) {
    operator_delete(_Var1._M_p,local_358._0_8_ + 1);
  }
  _Var1._M_p = local_358;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffffc98,"unnamed-rule","");
  local_190 = this + 0x70;
  *(MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> **)
   (this + 0x70) = local_190;
  local_38 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(this + 0x78);
  *(MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> **)
   (this + 0x78) = this + 0x88;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_38,_Var1._M_p,_Var1._M_p + (long)local_360.ref.t_);
  *(undefined8 *)(this + 0x98) = 0;
  if (_Var1._M_p != local_358) {
    operator_delete(_Var1._M_p,local_358._0_8_ + 1);
  }
  _Var1._M_p = local_358;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffffc98,"unnamed-rule","");
  local_1a0.t_ = (rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::locals<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
                  *)(this + 0xb8);
  *(rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::locals<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
    **)(this + 0xb8) = local_1a0.t_;
  *(MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> **)
   (this + 0xc0) = this + 0xd0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(this + 0xc0),_Var1._M_p,_Var1._M_p + (long)local_360.ref.t_);
  *(undefined8 *)(this + 0xe0) = 0;
  if (_Var1._M_p != local_358) {
    operator_delete(_Var1._M_p,local_358._0_8_ + 1);
  }
  _Var1._M_p = local_358;
  local_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(this + 0xc0);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffffc98,"unnamed-rule","");
  local_290._16_8_ = this + 0x100;
  *(undefined8 *)(this + 0x100) = local_290._16_8_;
  *(MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> **)
   (this + 0x108) = this + 0x118;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(this + 0x108),_Var1._M_p,_Var1._M_p + (long)local_360.ref.t_);
  *(undefined8 *)(this + 0x128) = 0;
  if (_Var1._M_p != local_358) {
    operator_delete(_Var1._M_p,local_358._0_8_ + 1);
  }
  _Var1._M_p = local_358;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffffc98,"unnamed-rule","");
  local_258._16_8_ = this + 0x148;
  *(undefined8 *)(this + 0x148) = local_258._16_8_;
  *(MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> **)
   (this + 0x150) = this + 0x160;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(this + 0x150),_Var1._M_p,_Var1._M_p + (long)local_360.ref.t_);
  *(undefined8 *)(this + 0x170) = 0;
  if (_Var1._M_p != local_358) {
    operator_delete(_Var1._M_p,local_358._0_8_ + 1);
  }
  _Var1._M_p = local_358;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffffc98,"unnamed-rule","");
  local_198 = (rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_lf::io::GMshFileV4::PhysicalName_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
               *)(this + 400);
  *(rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_lf::io::GMshFileV4::PhysicalName_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
    **)(this + 400) = local_198;
  local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(this + 0x198);
  *(MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> **)
   (this + 0x198) = this + 0x1a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_48,_Var1._M_p,_Var1._M_p + (long)local_360.ref.t_);
  *(undefined8 *)(this + 0x1b8) = 0;
  if (_Var1._M_p != local_358) {
    operator_delete(_Var1._M_p,local_358._0_8_ + 1);
  }
  _Var1._M_p = local_358;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffffc98,"unnamed-rule","");
  local_130 = this + 0x1d8;
  *(MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> **)
   (this + 0x1d8) = local_130;
  local_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(this + 0x1e0);
  *(MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> **)
   (this + 0x1e0) = this + 0x1f0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,_Var1._M_p,_Var1._M_p + (long)local_360.ref.t_);
  *(undefined8 *)(this + 0x200) = 0;
  if (_Var1._M_p != local_358) {
    operator_delete(_Var1._M_p,local_358._0_8_ + 1);
  }
  _Var1._M_p = local_358;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffffc98,"unnamed-rule","");
  *(rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::fusion::adapted::MshFileV4Adapted_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
    **)(this + 0x220) = local_220;
  local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(this + 0x228);
  *(MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> **)
   (this + 0x228) = this + 0x238;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_a8,_Var1._M_p,_Var1._M_p + (long)local_360.ref.t_);
  *(undefined8 *)(this + 0x248) = 0;
  if (_Var1._M_p != local_358) {
    operator_delete(_Var1._M_p,local_358._0_8_ + 1);
  }
  _Var1._M_p = local_358;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffffc98,"unnamed-rule","");
  local_110 = this + 0x268;
  *(MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> **)
   (this + 0x268) = local_110;
  local_58 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(this + 0x270);
  *(MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> **)
   (this + 0x270) = this + 0x280;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_58,_Var1._M_p,_Var1._M_p + (long)local_360.ref.t_);
  *(undefined8 *)(this + 0x290) = 0;
  if (_Var1._M_p != local_358) {
    operator_delete(_Var1._M_p,local_358._0_8_ + 1);
  }
  _Var1._M_p = local_358;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffffc98,"unnamed-rule","");
  local_118 = this + 0x2b0;
  *(MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> **)
   (this + 0x2b0) = local_118;
  local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(this + 0x2b8);
  *(MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> **)
   (this + 0x2b8) = this + 0x2c8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_60,_Var1._M_p,_Var1._M_p + (long)local_360.ref.t_);
  *(undefined8 *)(this + 0x2d8) = 0;
  if (_Var1._M_p != local_358) {
    operator_delete(_Var1._M_p,local_358._0_8_ + 1);
  }
  _Var1._M_p = local_358;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffffc98,"unnamed-rule","");
  local_1b8 = this + 0x2f8;
  *(MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> **)
   (this + 0x2f8) = local_1b8;
  local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(this + 0x300);
  *(MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> **)
   (this + 0x300) = this + 0x310;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_68,_Var1._M_p,_Var1._M_p + (long)local_360.ref.t_);
  *(undefined8 *)(this + 800) = 0;
  if (_Var1._M_p != local_358) {
    operator_delete(_Var1._M_p,local_358._0_8_ + 1);
  }
  _Var1._M_p = local_358;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffffc98,"unnamed-rule","");
  local_120 = this + 0x340;
  *(MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> **)
   (this + 0x340) = local_120;
  local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(this + 0x348);
  *(MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> **)
   (this + 0x348) = this + 0x358;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_70,_Var1._M_p,_Var1._M_p + (long)local_360.ref.t_);
  *(undefined8 *)(this + 0x368) = 0;
  if (_Var1._M_p != local_358) {
    operator_delete(_Var1._M_p,local_358._0_8_ + 1);
  }
  _Var1._M_p = local_358;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffffc98,"unnamed-rule","");
  local_128 = this + 0x388;
  *(MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> **)
   (this + 0x388) = local_128;
  local_78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(this + 0x390);
  *(MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> **)
   (this + 0x390) = this + 0x3a0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_78,_Var1._M_p,_Var1._M_p + (long)local_360.ref.t_);
  *(undefined8 *)(this + 0x3b0) = 0;
  if (_Var1._M_p != local_358) {
    operator_delete(_Var1._M_p,local_358._0_8_ + 1);
  }
  _Var1._M_p = local_358;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffffc98,"unnamed-rule","");
  local_1a8 = this + 0x3d0;
  *(MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> **)
   (this + 0x3d0) = local_1a8;
  local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(this + 0x3d8);
  *(MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> **)
   (this + 0x3d8) = this + 1000;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_80,_Var1._M_p,_Var1._M_p + (long)local_360.ref.t_);
  *(undefined8 *)(this + 0x3f8) = 0;
  if (_Var1._M_p != local_358) {
    operator_delete(_Var1._M_p,local_358._0_8_ + 1);
  }
  _Var1._M_p = local_358;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffffc98,"unnamed-rule","");
  local_1b0 = this + 0x418;
  *(MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> **)
   (this + 0x418) = local_1b0;
  local_88 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(this + 0x420);
  *(MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> **)
   (this + 0x420) = this + 0x430;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_88,_Var1._M_p,_Var1._M_p + (long)local_360.ref.t_);
  *(undefined8 *)(this + 0x440) = 0;
  if (_Var1._M_p != local_358) {
    operator_delete(_Var1._M_p,local_358._0_8_ + 1);
  }
  _Var1._M_p = local_358;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffffc98,"unnamed-rule","");
  local_140 = this + 0x460;
  *(MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> **)
   (this + 0x460) = local_140;
  local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(this + 0x468);
  *(MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> **)
   (this + 0x468) = this + 0x478;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_90,_Var1._M_p,_Var1._M_p + (long)local_360.ref.t_);
  *(undefined8 *)(this + 0x488) = 0;
  if (_Var1._M_p != local_358) {
    operator_delete(_Var1._M_p,local_358._0_8_ + 1);
  }
  _Var1._M_p = local_358;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffffc98,"unnamed-rule","");
  local_1c0 = this + 0x4a8;
  *(MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> **)
   (this + 0x4a8) = local_1c0;
  local_98 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(this + 0x4b0);
  *(MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> **)
   (this + 0x4b0) = this + 0x4c0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_98,_Var1._M_p,_Var1._M_p + (long)local_360.ref.t_);
  *(undefined8 *)(this + 0x4d0) = 0;
  if (_Var1._M_p != local_358) {
    operator_delete(_Var1._M_p,local_358._0_8_ + 1);
  }
  _Var1._M_p = local_358;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffffc98,"unnamed-rule","");
  local_1c8 = this + 0x4f0;
  *(MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> **)
   (this + 0x4f0) = local_1c8;
  local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(this + 0x4f8);
  *(MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> **)
   (this + 0x4f8) = this + 0x508;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_a0,_Var1._M_p,_Var1._M_p + (long)local_360.ref.t_);
  *(undefined8 *)(this + 0x518) = 0;
  if (_Var1._M_p != local_358) {
    operator_delete(_Var1._M_p,local_358._0_8_ + 1);
  }
  _Var1._M_p = local_358;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffffc98,"unnamed-rule","");
  local_138 = this + 0x538;
  *(MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> **)
   (this + 0x538) = local_138;
  local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(this + 0x540);
  *(MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> **)
   (this + 0x540) = this + 0x550;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_b0,_Var1._M_p,_Var1._M_p + (long)local_360.ref.t_);
  *(undefined8 *)(this + 0x560) = 0;
  if (_Var1._M_p != local_358) {
    operator_delete(_Var1._M_p,local_358._0_8_ + 1);
  }
  _Var1._M_p = local_358;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffffc98,"unnamed-rule","");
  local_1d0 = this + 0x580;
  *(MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> **)
   (this + 0x580) = local_1d0;
  local_b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(this + 0x588);
  *(MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> **)
   (this + 0x588) = this + 0x598;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_b8,_Var1._M_p,_Var1._M_p + (long)local_360.ref.t_);
  *(undefined8 *)(this + 0x5a8) = 0;
  if (_Var1._M_p != local_358) {
    operator_delete(_Var1._M_p,local_358._0_8_ + 1);
  }
  _Var1._M_p = local_358;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffffc98,"unnamed-rule","");
  local_148 = this + 0x5c8;
  *(MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> **)
   (this + 0x5c8) = local_148;
  local_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(this + 0x5d0);
  *(MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> **)
   (this + 0x5d0) = this + 0x5e0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_c0,_Var1._M_p,_Var1._M_p + (long)local_360.ref.t_);
  *(undefined8 *)(this + 0x5f0) = 0;
  if (_Var1._M_p != local_358) {
    operator_delete(_Var1._M_p,local_358._0_8_ + 1);
  }
  _Var1._M_p = local_358;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffffc98,"unnamed-rule","");
  local_1d8 = this + 0x610;
  *(MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> **)
   (this + 0x610) = local_1d8;
  local_c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(this + 0x618);
  *(MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> **)
   (this + 0x618) = this + 0x628;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_c8,_Var1._M_p,_Var1._M_p + (long)local_360.ref.t_);
  *(undefined8 *)(this + 0x638) = 0;
  if (_Var1._M_p != local_358) {
    operator_delete(_Var1._M_p,local_358._0_8_ + 1);
  }
  _Var1._M_p = local_358;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffffc98,"unnamed-rule","");
  local_150 = this + 0x658;
  *(MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> **)
   (this + 0x658) = local_150;
  local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(this + 0x660);
  *(MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> **)
   (this + 0x660) = this + 0x670;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_d0,_Var1._M_p,_Var1._M_p + (long)local_360.ref.t_);
  *(undefined8 *)(this + 0x680) = 0;
  if (_Var1._M_p != local_358) {
    operator_delete(_Var1._M_p,local_358._0_8_ + 1);
  }
  _Var1._M_p = local_358;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffffc98,"unnamed-rule","");
  local_158 = this + 0x6a0;
  *(MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> **)
   (this + 0x6a0) = local_158;
  local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(this + 0x6a8);
  *(MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> **)
   (this + 0x6a8) = this + 0x6b8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_d8,_Var1._M_p,_Var1._M_p + (long)local_360.ref.t_);
  *(undefined8 *)(this + 0x6c8) = 0;
  if (_Var1._M_p != local_358) {
    operator_delete(_Var1._M_p,local_358._0_8_ + 1);
  }
  _Var1._M_p = local_358;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffffc98,"unnamed-rule","");
  local_160 = this + 0x6e8;
  *(MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> **)
   (this + 0x6e8) = local_160;
  local_f3._19_8_ = this + 0x6f0;
  *(MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> **)
   (this + 0x6f0) = this + 0x700;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_f3._19_8_,_Var1._M_p,_Var1._M_p + (long)local_360.ref.t_);
  *(undefined8 *)(this + 0x710) = 0;
  if (_Var1._M_p != local_358) {
    operator_delete(_Var1._M_p,local_358._0_8_ + 1);
  }
  boost::
  function<bool(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,boost::spirit::context<boost::fusion::cons<std::__cxx11::string&,boost::fusion::nil_>,boost::fusion::vector<>>&,boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,boost::spirit::char_encoding::ascii>>const&)>
  ::operator=((function<bool(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,boost::spirit::context<boost::fusion::cons<std::__cxx11::string&,boost::fusion::nil_>,boost::fusion::vector<>>&,boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,boost::spirit::char_encoding::ascii>>const&)>
               *)(this + 0x50),
              (parser_binder<boost::spirit::qi::lexeme_directive<boost::spirit::qi::sequence<boost::fusion::cons<boost::spirit::qi::literal_char<boost::spirit::char_encoding::standard,_true,_false>,_boost::fusion::cons<boost::spirit::qi::plus<boost::spirit::qi::difference<boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::char_,_boost::spirit::char_encoding::standard>_>,_boost::spirit::qi::literal_char<boost::spirit::char_encoding::standard,_true,_false>_>_>,_boost::fusion::cons<boost::spirit::qi::literal_char<boost::spirit::char_encoding::standard,_true,_false>,_boost::fusion::nil_>_>_>_>_>,_mpl_::bool_<true>_>
               *)&stack0xfffffffffffffc98);
  _Var1._M_p = local_358;
  std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xfffffffffffffc98,"string","");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(this + 0x30),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xfffffffffffffc98);
  if (_Var1._M_p != local_358) {
    operator_delete(_Var1._M_p,local_358._0_8_ + 1);
  }
  boost::
  function<bool(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,boost::spirit::context<boost::fusion::cons<Eigen::Matrix<double,3,1,0,3,1>&,boost::fusion::nil_>,boost::fusion::vector<>>&,boost::spirit::unused_type_const&)>
  ::operator=((function<bool(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,boost::spirit::context<boost::fusion::cons<Eigen::Matrix<double,3,1,0,3,1>&,boost::fusion::nil_>,boost::fusion::vector<>>&,boost::spirit::unused_type_const&)>
               *)(this + 0x128),
              (parser_binder<boost::spirit::qi::expect_operator<boost::fusion::cons<boost::spirit::qi::any_binary_parser<boost::spirit::qi::detail::floating_point<64>,_(boost::endian::order)0,_64>,_boost::fusion::cons<boost::spirit::qi::any_binary_parser<boost::spirit::qi::detail::floating_point<64>,_(boost::endian::order)0,_64>,_boost::fusion::cons<boost::spirit::qi::any_binary_parser<boost::spirit::qi::detail::floating_point<64>,_(boost::endian::order)0,_64>,_boost::fusion::nil_>_>_>_>,_mpl_::bool_<true>_>
               *)&stack0xfffffffffffffc98);
  _Var1._M_p = local_358;
  std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xfffffffffffffc98,"vec3","");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(this + 0x108),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xfffffffffffffc98);
  if (_Var1._M_p != local_358) {
    operator_delete(_Var1._M_p,local_358._0_8_ + 1);
  }
  boost::
  function<bool(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,boost::spirit::context<boost::fusion::cons<std::vector<int,std::allocator<int>>&,boost::fusion::nil_>,boost::fusion::vector<unsigned_long>>&,boost::spirit::unused_type_const&)>
  ::operator=((function<bool(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,boost::spirit::context<boost::fusion::cons<std::vector<int,std::allocator<int>>&,boost::fusion::nil_>,boost::fusion::vector<unsigned_long>>&,boost::spirit::unused_type_const&)>
               *)(this + 0x170),
              (parser_binder<boost::spirit::qi::expect_operator<boost::fusion::cons<boost::spirit::qi::omit_directive<boost::spirit::qi::action<boost::spirit::qi::any_binary_parser<boost::spirit::qi::detail::integer<64>,_(boost::endian::order)0,_64>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::comma,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,_boost::proto::argsns_::list3<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::phoenix::stl::reserve>,_0L>,_boost::phoenix::actor<boost::spirit::attribute<0>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_3L>_>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::spirit::local_variable<0>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_>_>,_2L>_>_>_>,_boost::fusion::cons<boost::spirit::qi::lazy_directive<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,_boost::proto::argsns_::list2<boost::spirit::terminal<boost::spirit::tag::repeat>,_boost::phoenix::actor<boost::spirit::local_variable<0>_>_>,_2L>_>,_boost::spirit::qi::any_binary_parser<boost::spirit::qi::detail::integer<32>,_(boost::endian::order)0,_32>,_boost::spirit::unused_type>,_boost::fusion::nil_>_>_>,_mpl_::bool_<true>_>
               *)&stack0xfffffffffffffc98);
  _Var1._M_p = local_358;
  std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xfffffffffffffc98,"int_vec","");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(this + 0x150),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xfffffffffffffc98);
  if (_Var1._M_p != local_358) {
    operator_delete(_Var1._M_p,local_358._0_8_ + 1);
  }
  local_230.manager =
       (_func_void_function_buffer_ptr_function_buffer_ptr_functor_manager_operation_type *)
       &local_2d0;
  local_2d0 = (rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::locals<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
               *)0x33522f;
  local_330._0_8_ = &local_230;
  local_200._M_allocated_capacity = (size_type)local_2c0;
  local_2c0._0_8_ = "$Entities";
  local_330._8_8_ = &local_200;
  local_320 = (function_buffer *)local_330;
  local_210 = (function_buffer *)local_2a0;
  local_2a0._0_8_ = "$PartitionedEntities";
  local_318 = (MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> *)
              &local_210;
  local_310 = &local_320;
  local_170 = (rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::locals<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
               *)(local_2c0 + 0x10);
  local_2b0._0_8_ = "$Nodes";
  local_180 = &local_290;
  local_290.members.obj_ptr = "$Elements";
  local_258._0_8_ = "$Periodic";
  local_1e8 = (MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> *)
              &local_278;
  local_278 = (MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> *)
              0x33aa43;
  local_1f0.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::locals<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )&local_240;
  local_240.manager =
       (_func_void_function_buffer_ptr_function_buffer_ptr_functor_manager_operation_type *)
       &boost::spirit::standard::char_;
  local_238 = (MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> *)
              &boost::spirit::eol;
  local_308 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)&local_170;
  local_300 = &local_310;
  local_2f8 = (MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> *)
              &local_180;
  local_2f0 = &local_300;
  local_2e8 = (MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> *)
              &local_1e0;
  local_2e0 = (MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
               ******)&local_2f0;
  local_2d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)&local_1e8;
  local_268.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::locals<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )&local_218;
  local_218 = (MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> **
              )CONCAT71(local_218._1_7_,0x24);
  local_260 = (vtable_base *)&local_1f0;
  local_1e0 = (rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::locals<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
               *)local_258;
  boost::spirit::qi::
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::define<_25c99c33_>(local_190);
  _Var1._M_p = local_358;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffffc98,"Start of Comment","");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &stack0xfffffffffffffc98);
  if (_Var1._M_p != local_358) {
    operator_delete(_Var1._M_p,local_358._0_8_ + 1);
  }
  local_358._0_2_ = 0x2400;
  local_358._8_8_ = "$End";
  boost::
  function<bool(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,boost::spirit::context<boost::fusion::cons<boost::spirit::unused_type&,boost::fusion::nil_>,boost::fusion::vector<std::__cxx11::string>>&,boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,boost::spirit::char_encoding::ascii>>const&)>
  ::operator=((function<bool(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,boost::spirit::context<boost::fusion::cons<boost::spirit::unused_type&,boost::fusion::nil_>,boost::fusion::vector<std::__cxx11::string>>&,boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,boost::spirit::char_encoding::ascii>>const&)>
               *)(this + 0xe0),
              (parser_binder<boost::spirit::qi::expect_operator<boost::fusion::cons<boost::spirit::qi::action<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::spirit::local_variable<0>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_>_>,_boost::fusion::cons<boost::spirit::qi::sequence<boost::fusion::cons<boost::spirit::qi::kleene<boost::spirit::qi::difference<boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::char_,_boost::spirit::char_encoding::standard>_>,_boost::spirit::qi::literal_char<boost::spirit::char_encoding::standard,_true,_false>_>_>,_boost::fusion::cons<boost::spirit::qi::literal_string<const_char_(&)[5],_true>,_boost::fusion::cons<boost::spirit::qi::lazy_parser<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,_boost::proto::argsns_::list2<boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>,_boost::phoenix::actor<boost::spirit::local_variable<0>_>_>,_2L>_>,_boost::spirit::unused_type>,_boost::fusion::nil_>_>_>_>,_boost::fusion::nil_>_>_>,_mpl_::bool_<true>_>
               *)&stack0xfffffffffffffc98);
  _Var1._M_p = local_358;
  std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xfffffffffffffc98,"comment","");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &stack0xfffffffffffffc98);
  if (_Var1._M_p != local_358) {
    operator_delete(_Var1._M_p,local_358._0_8_ + 1);
  }
  boost::spirit::qi::
  on_error<(boost::spirit::qi::error_handler_result)0,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::spirit::locals<std::__cxx11::string,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,boost::spirit::char_encoding::ascii>>,0l>,boost::spirit::unused_type,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,boost::proto::argsns_::list5<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<lf::io::(anonymous_namespace)::MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>::ErrorHandler>,0l>,boost::phoenix::actor<boost::spirit::argument<0>>,boost::phoenix::actor<boost::spirit::argument<1>>,boost::phoenix::actor<boost::spirit::argument<2>>,boost::phoenix::actor<boost::spirit::argument<3>>>,5l>>>
            (local_1a0.t_,(expr_type)SUB85(_Var1._M_p,0));
  local_358._0_8_ = *(undefined8 *)local_108;
  boost::
  function<bool(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,boost::spirit::context<boost::fusion::cons<lf::io::GMshFileV4::PhysicalName&,boost::fusion::nil_>,boost::fusion::vector<>>&,boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,boost::spirit::char_encoding::ascii>>const&)>
  ::operator=((function<bool(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,boost::spirit::context<boost::fusion::cons<lf::io::GMshFileV4::PhysicalName&,boost::fusion::nil_>,boost::fusion::vector<>>&,boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,boost::spirit::char_encoding::ascii>>const&)>
               *)(this + 0x1b8),
              (parser_binder<boost::spirit::qi::expect_operator<boost::fusion::cons<boost::spirit::qi::any_int_parser<int,_10U,_1U,__1>,_boost::fusion::cons<boost::spirit::qi::any_int_parser<int,_10U,_1U,__1>,_boost::fusion::cons<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>,_boost::fusion::nil_>_>_>_>,_mpl_::bool_<true>_>
               *)&stack0xfffffffffffffc98);
  _Var1._M_p = local_358;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffffc98,"Physical Name","");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (local_48,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &stack0xfffffffffffffc98);
  if (_Var1._M_p != local_358) {
    operator_delete(_Var1._M_p,local_358._0_8_ + 1);
  }
  boost::spirit::qi::
  on_error<(boost::spirit::qi::error_handler_result)0,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,lf::io::GMshFileV4::PhysicalName(),boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,boost::spirit::char_encoding::ascii>>,0l>,boost::spirit::unused_type,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,boost::proto::argsns_::list5<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<lf::io::(anonymous_namespace)::MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>::ErrorHandler>,0l>,boost::phoenix::actor<boost::spirit::argument<0>>,boost::phoenix::actor<boost::spirit::argument<1>>,boost::phoenix::actor<boost::spirit::argument<2>>,boost::phoenix::actor<boost::spirit::argument<3>>>,5l>>>
            (local_198,(expr_type)SUB85(_Var1._M_p,0));
  local_358._8_8_ =
       (local_198->
       super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_lf::io::GMshFileV4::PhysicalName_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_lf::io::GMshFileV4::PhysicalName_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
       ).proto_expr_.child0.ref.t_;
  local_340.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<int,_std::allocator<int>_>,_boost::spirit::locals<unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<int,_std::allocator<int>_>,_boost::spirit::locals<unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::spirit::unused_type,_boost::spirit::unused_type>
          *)0x335283;
  boost::
  function<bool_(__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<std::vector<lf::io::GMshFileV4::PhysicalName,_std::allocator<lf::io::GMshFileV4::PhysicalName>_>_&,_boost::fusion::nil_>,_boost::fusion::vector<unsigned_long>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&)>
  ::operator=<_650b6b73_>
            ((function<bool_(__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<std::vector<lf::io::GMshFileV4::PhysicalName,_std::allocator<lf::io::GMshFileV4::PhysicalName>_>_&,_boost::fusion::nil_>,_boost::fusion::vector<unsigned_long>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&)>
              *)(this + 0x200),
             (parser_binder<boost::spirit::qi::expect_operator<boost::fusion::cons<boost::spirit::qi::literal_string<const_char_(&)[15],_true>,_boost::fusion::cons<boost::spirit::qi::omit_directive<boost::spirit::qi::action<boost::spirit::qi::any_uint_parser<unsigned_long_long,_10U,_1U,__1>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::comma,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,_boost::proto::argsns_::list3<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::phoenix::stl::reserve>,_0L>,_boost::phoenix::actor<boost::spirit::attribute<0>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_3L>_>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::spirit::local_variable<0>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_>_>,_2L>_>_>_>,_boost::fusion::cons<boost::spirit::qi::lazy_directive<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,_boost::proto::argsns_::list2<boost::spirit::terminal<boost::spirit::tag::repeat>,_boost::phoenix::actor<boost::spirit::local_variable<0>_>_>,_2L>_>,_boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_lf::io::GMshFileV4::PhysicalName_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>,_boost::spirit::unused_type>,_boost::fusion::cons<boost::spirit::qi::literal_string<const_char_(&)[18],_true>,_boost::fusion::nil_>_>_>_>_>,_mpl_::bool_<true>_>
              *)&stack0xfffffffffffffc98);
  _Var1._M_p = local_358;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffffc98,"$PhysicalNames","");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &stack0xfffffffffffffc98);
  if (_Var1._M_p != local_358) {
    operator_delete(_Var1._M_p,local_358._0_8_ + 1);
  }
  local_358._0_8_ = *(undefined8 *)local_258._16_8_;
  boost::
  function<bool(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,boost::spirit::context<boost::fusion::cons<lf::io::GMshFileV4::PointEntity&,boost::fusion::nil_>,boost::fusion::vector<>>&,boost::spirit::unused_type_const&)>
  ::operator=((function<bool(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,boost::spirit::context<boost::fusion::cons<lf::io::GMshFileV4::PointEntity&,boost::fusion::nil_>,boost::fusion::vector<>>&,boost::spirit::unused_type_const&)>
               *)(this + 0x290),
              (parser_binder<boost::spirit::qi::expect_operator<boost::fusion::cons<boost::spirit::qi::any_binary_parser<boost::spirit::qi::detail::integer<32>,_(boost::endian::order)0,_32>,_boost::fusion::cons<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>,_boost::fusion::cons<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<int,_std::allocator<int>_>,_boost::spirit::locals<unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>,_boost::fusion::nil_>_>_>_>,_mpl_::bool_<true>_>
               *)&stack0xfffffffffffffc98);
  _Var1._M_p = local_358;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffffc98,"Point entity","");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &stack0xfffffffffffffc98);
  if (_Var1._M_p != local_358) {
    operator_delete(_Var1._M_p,local_358._0_8_ + 1);
  }
  local_358._8_8_ = *(undefined8 *)local_258._16_8_;
  local_358._0_8_ = *(undefined8 *)local_290._16_8_;
  local_348.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(reference_wrapper<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
          )local_358._8_8_;
  boost::
  function<bool(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,boost::spirit::context<boost::fusion::cons<lf::io::GMshFileV4::Entity&,boost::fusion::nil_>,boost::fusion::vector<>>&,boost::spirit::unused_type_const&)>
  ::operator=((function<bool(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,boost::spirit::context<boost::fusion::cons<lf::io::GMshFileV4::Entity&,boost::fusion::nil_>,boost::fusion::vector<>>&,boost::spirit::unused_type_const&)>
               *)(this + 0x2d8),
              (parser_binder<boost::spirit::qi::expect_operator<boost::fusion::cons<boost::spirit::qi::any_binary_parser<boost::spirit::qi::detail::integer<32>,_(boost::endian::order)0,_32>,_boost::fusion::cons<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>,_boost::fusion::cons<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>,_boost::fusion::cons<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<int,_std::allocator<int>_>,_boost::spirit::locals<unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>,_boost::fusion::cons<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<int,_std::allocator<int>_>,_boost::spirit::locals<unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>,_boost::fusion::nil_>_>_>_>_>_>,_mpl_::bool_<true>_>
               *)&stack0xfffffffffffffc98);
  _Var1._M_p = local_358;
  std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xfffffffffffffc98,"entity","");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (local_60,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &stack0xfffffffffffffc98);
  if (_Var1._M_p != local_358) {
    operator_delete(_Var1._M_p,local_358._0_8_ + 1);
  }
  local_2b0._0_8_ = &boost::spirit::big_qword;
  local_2b0._8_8_ = &local_1e0;
  local_2a0._0_8_ = &boost::spirit::omit;
  local_2a0._8_8_ = local_2c0 + 0x10;
  local_2c0._0_8_ = "$Entities\n";
  local_2c0._8_8_ = local_2a0;
  local_258._0_8_ = &boost::spirit::big_qword;
  local_258._8_8_ = &local_1e8;
  local_290.members.obj_ptr = &boost::spirit::omit;
  local_2d0 = (rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::locals<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
               *)local_2c0;
  local_2c8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)&local_290;
  local_268.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::locals<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )&boost::spirit::big_qword;
  local_260 = (vtable_base *)&local_1f0;
  local_278 = (MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> *)
              &boost::spirit::omit;
  local_270 = &local_268;
  local_330._0_8_ = &local_2d0;
  local_330._8_8_ = &local_278;
  local_230.manager =
       (_func_void_function_buffer_ptr_function_buffer_ptr_functor_manager_operation_type *)
       &boost::spirit::big_qword;
  local_228 = (MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> *)
              &local_218;
  local_240.manager =
       (_func_void_function_buffer_ptr_function_buffer_ptr_functor_manager_operation_type *)
       &boost::spirit::omit;
  local_238 = (MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> *)
              &local_230;
  local_320 = (function_buffer *)local_330;
  local_318 = (MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> *)
              &local_240;
  local_200._M_allocated_capacity = (size_type)&local_188;
  local_200._8_8_ = local_110;
  local_310 = &local_320;
  local_308 = &local_200;
  local_170 = (rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::locals<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
               *)(local_f9 + 3);
  local_180 = (function_buffer *)local_f9;
  local_208 = local_118;
  local_300 = &local_310;
  local_2f8 = (MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> *)
              &local_210;
  local_168 = local_118;
  local_2f0 = &local_300;
  local_2e8 = (MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> *)
              &local_170;
  local_178 = local_118;
  local_2e0 = (MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
               ******)&local_2f0;
  local_2d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)&local_180;
  local_290._8_8_ =
       (rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::locals<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
        *)local_258;
  local_210 = (function_buffer *)local_f3;
  boost::spirit::qi::
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::tuple<std::vector<lf::io::GMshFileV4::PointEntity,_std::allocator<lf::io::GMshFileV4::PointEntity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>_>_(),_boost::spirit::locals<unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::define<_749e747a_>(local_1b8);
  _Var1._M_p = local_358;
  std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xfffffffffffffc98,"$Entities","")
  ;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (local_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &stack0xfffffffffffffc98);
  if (_Var1._M_p != local_358) {
    operator_delete(_Var1._M_p,local_358._0_8_ + 1);
  }
  boost::
  function<bool_(__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<std::vector<lf::io::GMshFileV4::GhostEntity,_std::allocator<lf::io::GMshFileV4::GhostEntity>_>_&,_boost::fusion::nil_>,_boost::fusion::vector<unsigned_long>_>_&,_const_boost::spirit::unused_type_&)>
  ::
  operator=<boost::spirit::qi::detail::parser_binder<boost::spirit::qi::expect_operator<boost::fusion::cons<boost::spirit::qi::omit_directive<boost::spirit::qi::action<boost::spirit::qi::any_binary_parser<boost::spirit::qi::detail::integer<64>,_(boost::endian::order)0,_64>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::comma,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,_boost::proto::argsns_::list3<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::phoenix::stl::reserve>,_0L>,_boost::phoenix::actor<boost::spirit::attribute<0>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_3L>_>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::spirit::local_variable<0>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_>_>,_2L>_>_>_>,_boost::fusion::cons<boost::spirit::qi::lazy_directive<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,_boost::proto::argsns_::list2<boost::spirit::terminal<boost::spirit::tag::repeat>,_boost::phoenix::actor<boost::spirit::local_variable<0>_>_>,_2L>_>,_boost::spirit::qi::expect_operator<boost::fusion::cons<boost::spirit::qi::any_binary_parser<boost::spirit::qi::detail::integer<32>,_(boost::endian::order)0,_32>,_boost::fusion::cons<boost::spirit::qi::any_binary_parser<boost::spirit::qi::detail::integer<32>,_(boost::endian::order)0,_32>,_boost::fusion::nil_>_>_>,_boost::spirit::unused_type>,_boost::fusion::nil_>_>_>,_mpl_::bool_<true>_>_>
            ((function<bool_(__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<std::vector<lf::io::GMshFileV4::GhostEntity,_std::allocator<lf::io::GMshFileV4::GhostEntity>_>_&,_boost::fusion::nil_>,_boost::fusion::vector<unsigned_long>_>_&,_const_boost::spirit::unused_type_&)>
              *)(this + 0x368),
             (parser_binder<boost::spirit::qi::expect_operator<boost::fusion::cons<boost::spirit::qi::omit_directive<boost::spirit::qi::action<boost::spirit::qi::any_binary_parser<boost::spirit::qi::detail::integer<64>,_(boost::endian::order)0,_64>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::comma,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,_boost::proto::argsns_::list3<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::phoenix::stl::reserve>,_0L>,_boost::phoenix::actor<boost::spirit::attribute<0>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_3L>_>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::spirit::local_variable<0>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_>_>,_2L>_>_>_>,_boost::fusion::cons<boost::spirit::qi::lazy_directive<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,_boost::proto::argsns_::list2<boost::spirit::terminal<boost::spirit::tag::repeat>,_boost::phoenix::actor<boost::spirit::local_variable<0>_>_>,_2L>_>,_boost::spirit::qi::expect_operator<boost::fusion::cons<boost::spirit::qi::any_binary_parser<boost::spirit::qi::detail::integer<32>,_(boost::endian::order)0,_32>,_boost::fusion::cons<boost::spirit::qi::any_binary_parser<boost::spirit::qi::detail::integer<32>,_(boost::endian::order)0,_32>,_boost::fusion::nil_>_>_>,_boost::spirit::unused_type>,_boost::fusion::nil_>_>_>,_mpl_::bool_<true>_>
              *)&stack0xfffffffffffffc98);
  _Var1._M_p = local_358;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffffc98,"ghost_entities","");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (local_70,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &stack0xfffffffffffffc98);
  if (_Var1._M_p != local_358) {
    operator_delete(_Var1._M_p,local_358._0_8_ + 1);
  }
  local_358._8_8_ = *(undefined8 *)local_258._16_8_;
  local_348.ref.t_ =
       *(reference_wrapper<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
         *)local_290._16_8_;
  local_340.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<int,_std::allocator<int>_>,_boost::spirit::locals<unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(reference_wrapper<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<int,_std::allocator<int>_>,_boost::spirit::locals<unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
          )local_358._8_8_;
  boost::
  function<bool(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,boost::spirit::context<boost::fusion::cons<lf::io::GMshFileV4::PartitionedPointEntity&,boost::fusion::nil_>,boost::fusion::vector<>>&,boost::spirit::unused_type_const&)>
  ::operator=((function<bool(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,boost::spirit::context<boost::fusion::cons<lf::io::GMshFileV4::PartitionedPointEntity&,boost::fusion::nil_>,boost::fusion::vector<>>&,boost::spirit::unused_type_const&)>
               *)(this + 0x3b0),
              (parser_binder<boost::spirit::qi::expect_operator<boost::fusion::cons<boost::spirit::qi::any_binary_parser<boost::spirit::qi::detail::integer<32>,_(boost::endian::order)0,_32>,_boost::fusion::cons<boost::spirit::qi::any_binary_parser<boost::spirit::qi::detail::integer<32>,_(boost::endian::order)0,_32>,_boost::fusion::cons<boost::spirit::qi::any_binary_parser<boost::spirit::qi::detail::integer<32>,_(boost::endian::order)0,_32>,_boost::fusion::cons<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<int,_std::allocator<int>_>,_boost::spirit::locals<unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>,_boost::fusion::cons<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>,_boost::fusion::cons<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<int,_std::allocator<int>_>,_boost::spirit::locals<unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>,_boost::fusion::nil_>_>_>_>_>_>_>,_mpl_::bool_<true>_>
               *)&stack0xfffffffffffffc98);
  _Var1._M_p = local_358;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffffc98,"partitioned_point_entity","");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &stack0xfffffffffffffc98);
  if (_Var1._M_p != local_358) {
    operator_delete(_Var1._M_p,local_358._0_8_ + 1);
  }
  local_330._0_8_ = &boost::spirit::big_dword;
  local_330._8_8_ = &boost::spirit::big_dword;
  local_320 = (function_buffer *)local_330;
  local_318 = (MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> *)
              &boost::spirit::big_dword;
  local_310 = &local_320;
  local_308 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_258._16_8_;
  local_300 = &local_310;
  local_2f8 = (MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> *)
              local_290._16_8_;
  local_2f0 = &local_300;
  local_2e8 = (MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> *)
              local_290._16_8_;
  local_2e0 = (MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
               ******)&local_2f0;
  local_2d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_258._16_8_;
  boost::spirit::qi::
  rule<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,lf::io::GMshFileV4::PartitionedEntity(),boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>
  ::
  define<mpl_::bool_<true>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::spirit::terminal<boost::spirit::tag::big_dword>const&,boost::spirit::terminal<boost::spirit::tag::big_dword>const&>,2l>const&,boost::spirit::terminal<boost::spirit::tag::big_dword>const&>,2l>const&,boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::vector<int,std::allocator<int>>,bo___a,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,boost::spirit::unused_type,boost::spirit::unused_type>&>,2l>>
            (local_1a8);
  _Var1._M_p = local_358;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffffc98,"partitioned_entity","");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (local_80,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &stack0xfffffffffffffc98);
  if (_Var1._M_p != local_358) {
    operator_delete(_Var1._M_p,local_358._0_8_ + 1);
  }
  local_2c0._0_8_ = &boost::spirit::big_qword;
  local_2c0._8_8_ = &local_170;
  local_2d0 = (rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::locals<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
               *)&boost::spirit::omit;
  local_2c8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2c0;
  local_2b0._0_8_ = &boost::spirit::big_qword;
  local_2b0._8_8_ = &local_180;
  local_2a0._0_8_ = &boost::spirit::omit;
  local_2a0._8_8_ = local_2c0 + 0x10;
  local_330._0_8_ = &local_2d0;
  local_330._8_8_ = local_2a0;
  local_258._0_8_ = &boost::spirit::big_qword;
  local_258._8_8_ = &local_1e0;
  local_290.members.obj_ptr = &boost::spirit::omit;
  local_290._8_8_ = local_258;
  local_320 = (function_buffer *)local_330;
  local_318 = (MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> *)
              &local_290;
  local_268.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::locals<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )&boost::spirit::big_qword;
  local_260 = (vtable_base *)&local_1e8;
  local_278 = (MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> *)
              &boost::spirit::omit;
  local_270 = &local_268;
  local_310 = &local_320;
  local_308 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)&local_278;
  local_240.manager =
       (_func_void_function_buffer_ptr_function_buffer_ptr_functor_manager_operation_type *)
       &local_1f0;
  local_238 = local_128;
  local_300 = &local_310;
  local_2f8 = (MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> *)
              &local_240;
  local_230.manager =
       (_func_void_function_buffer_ptr_function_buffer_ptr_functor_manager_operation_type *)
       &local_218;
  local_228 = local_1a8;
  local_2f0 = &local_300;
  local_2e8 = (MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> *)
              &local_230;
  local_200._M_allocated_capacity = (size_type)&local_188;
  local_200._8_8_ = local_1a8;
  local_2e0 = (MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
               ******)&local_2f0;
  local_2d8 = &local_200;
  local_208 = local_1a8;
  local_210 = (function_buffer *)local_f3;
  boost::spirit::qi::
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::tuple<std::vector<lf::io::GMshFileV4::PartitionedPointEntity,_std::allocator<lf::io::GMshFileV4::PartitionedPointEntity>_>,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>_>_(),_boost::spirit::locals<unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::define<_6acd7d1_>(local_1b0);
  _Var1._M_p = local_358;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffffc98,"partitioned_entities2","");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (local_88,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &stack0xfffffffffffffc98);
  if (_Var1._M_p != local_358) {
    operator_delete(_Var1._M_p,local_358._0_8_ + 1);
  }
  local_358._8_8_ = *(undefined8 *)local_1b0;
  local_358._0_8_ = *(undefined8 *)local_120;
  local_348.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
          *)0x3405eb;
  boost::
  function<bool(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,boost::spirit::context<boost::fusion::cons<lf::io::GMshFileV4::PartitionedEntities&,boost::fusion::nil_>,boost::fusion::vector<>>&,boost::spirit::unused_type_const&)>
  ::operator=((function<bool(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,boost::spirit::context<boost::fusion::cons<lf::io::GMshFileV4::PartitionedEntities&,boost::fusion::nil_>,boost::fusion::vector<>>&,boost::spirit::unused_type_const&)>
               *)(this + 0x488),
              (parser_binder<boost::spirit::qi::expect_operator<boost::fusion::cons<boost::spirit::qi::literal_string<const_char_(&)[22],_true>,_boost::fusion::cons<boost::spirit::qi::any_binary_parser<boost::spirit::qi::detail::integer<64>,_(boost::endian::order)0,_64>,_boost::fusion::cons<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<lf::io::GMshFileV4::GhostEntity,_std::allocator<lf::io::GMshFileV4::GhostEntity>_>_(),_boost::spirit::locals<unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>,_boost::fusion::cons<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::tuple<std::vector<lf::io::GMshFileV4::PartitionedPointEntity,_std::allocator<lf::io::GMshFileV4::PartitionedPointEntity>_>,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>_>_(),_boost::spirit::locals<unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>,_boost::fusion::cons<boost::spirit::qi::literal_string<const_char_(&)[25],_true>,_boost::fusion::nil_>_>_>_>_>_>,_mpl_::bool_<true>_>
               *)&stack0xfffffffffffffc98);
  _Var1._M_p = local_358;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffffc98,"partitioned_entities","");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (local_90,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &stack0xfffffffffffffc98);
  if (_Var1._M_p != local_358) {
    operator_delete(_Var1._M_p,local_358._0_8_ + 1);
  }
  local_320 = (function_buffer *)&boost::spirit::big_dword;
  local_318 = (MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> *)
              &boost::spirit::big_dword;
  local_310 = &local_320;
  local_308 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)&boost::spirit::big_dword;
  local_2c0._8_8_ = (pointer)0x0;
  local_2d0 = (rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::locals<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
               *)&boost::spirit::big_qword;
  local_2c8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2c0;
  local_330._0_8_ = &boost::spirit::omit;
  local_330._8_8_ = &local_2d0;
  local_300 = &local_310;
  local_2f8 = (MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> *)
              local_330;
  local_290.members.obj_ptr = &boost::spirit::big_qword;
  local_290._8_8_ = &local_200;
  local_2b0._0_8_ = &local_170;
  local_2b0._8_8_ = &local_290;
  local_2a0._0_8_ = &boost::spirit::omit;
  local_2a0._8_8_ = local_2c0 + 0x10;
  local_2f0 = &local_300;
  local_2e8 = (MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> *)
              local_2a0;
  local_230.manager =
       (_func_void_function_buffer_ptr_function_buffer_ptr_functor_manager_operation_type *)0x0;
  local_258._0_8_ = &boost::spirit::eps;
  local_258._8_8_ = &local_230;
  local_2e0 = (MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
               ******)&local_2f0;
  local_2d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_258;
  local_240.manager =
       (_func_void_function_buffer_ptr_function_buffer_ptr_functor_manager_operation_type *)
       local_290._16_8_;
  local_238 = (MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> *)
              &local_210;
  local_268.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::locals<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )&local_180;
  local_260 = &local_240;
  local_278 = (MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> *)
              &boost::spirit::omit;
  local_270 = &local_268;
  boost::spirit::qi::
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_lf::io::GMshFileV4::NodeBlock_(),_boost::spirit::locals<unsigned_long,_unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::define<_e5610272_>(local_1c0);
  _Var1._M_p = local_358;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffffc98,"node_block","");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (local_98,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &stack0xfffffffffffffc98);
  if (_Var1._M_p != local_358) {
    operator_delete(_Var1._M_p,local_358._0_8_ + 1);
  }
  local_2d0 = (rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::locals<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
               *)&boost::spirit::big_qword;
  local_2c8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a0;
  local_330._0_8_ = &boost::spirit::omit;
  local_330._8_8_ = &local_2d0;
  local_320 = (function_buffer *)0x340604;
  local_318 = (MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> *)
              local_330;
  local_310 = &local_320;
  local_308 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)&boost::spirit::big_qword;
  local_300 = &local_310;
  local_2f8 = (MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> *)
              &boost::spirit::big_qword;
  local_2f0 = &local_300;
  local_2e8 = (MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> *)
              &boost::spirit::big_qword;
  local_2c0._0_8_ = (long)local_2c0 + 0x10;
  local_2c0._8_8_ = local_1c0;
  local_2e0 = (MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
               ******)&local_2f0;
  local_2d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2c0;
  boost::spirit::qi::
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_lf::io::GMshFileV4::Nodes_(),_boost::spirit::locals<unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::define<_1fce25ab_>(local_1c8);
  _Var1._M_p = local_358;
  std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xfffffffffffffc98,"nodes","");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (local_a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &stack0xfffffffffffffc98);
  if (_Var1._M_p != local_358) {
    operator_delete(_Var1._M_p,local_358._0_8_ + 1);
  }
  boost::
  function<bool_(__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<lf::io::GMshFileV4::ElementBlock_&,_boost::fusion::nil_>,_boost::fusion::vector<unsigned_long>_>_&,_const_boost::spirit::unused_type_&)>
  ::operator=<_b5bbf436_>
            ((function<bool_(__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<lf::io::GMshFileV4::ElementBlock_&,_boost::fusion::nil_>,_boost::fusion::vector<unsigned_long>_>_&,_const_boost::spirit::unused_type_&)>
              *)(this + 0x560),(parser_binder<_475885d_> *)&stack0xfffffffffffffc98);
  _Var1._M_p = local_358;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffffc98,"element_block","");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (local_b0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &stack0xfffffffffffffc98);
  if (_Var1._M_p != local_358) {
    operator_delete(_Var1._M_p,local_358._0_8_ + 1);
  }
  local_2d0 = (rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::locals<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
               *)&boost::spirit::big_qword;
  local_2c8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a0;
  local_330._0_8_ = &boost::spirit::omit;
  local_330._8_8_ = &local_2d0;
  local_320 = (function_buffer *)0x340617;
  local_318 = (MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> *)
              local_330;
  local_310 = &local_320;
  local_308 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)&boost::spirit::big_qword;
  local_300 = &local_310;
  local_2f8 = (MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> *)
              &boost::spirit::big_qword;
  local_2f0 = &local_300;
  local_2e8 = (MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> *)
              &boost::spirit::big_qword;
  local_2c0._0_8_ = (long)local_2c0 + 0x10;
  local_2c0._8_8_ = local_138;
  local_2e0 = (MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
               ******)&local_2f0;
  local_2d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2c0;
  boost::spirit::qi::
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_lf::io::GMshFileV4::Elements_(),_boost::spirit::locals<unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::define<_456da34c_>(local_1d0);
  _Var1._M_p = local_358;
  std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xfffffffffffffc98,"elements","");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (local_b8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &stack0xfffffffffffffc98);
  if (_Var1._M_p != local_358) {
    operator_delete(_Var1._M_p,local_358._0_8_ + 1);
  }
  boost::
  function<bool(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,boost::spirit::context<boost::fusion::cons<Eigen::Matrix<double,4,4,0,4,4>&,boost::fusion::nil_>,boost::fusion::vector<>>&,boost::spirit::unused_type_const&)>
  ::operator=((function<bool(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,boost::spirit::context<boost::fusion::cons<Eigen::Matrix<double,4,4,0,4,4>&,boost::fusion::nil_>,boost::fusion::vector<>>&,boost::spirit::unused_type_const&)>
               *)(this + 0x5f0),(parser_binder<_3ca2869c_> *)&stack0xfffffffffffffc98);
  _Var1._M_p = local_358;
  std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xfffffffffffffc98,"matrix4d","");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (local_c0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &stack0xfffffffffffffc98);
  if (_Var1._M_p != local_358) {
    operator_delete(_Var1._M_p,local_358._0_8_ + 1);
  }
  local_310 = (function_buffer **)&boost::spirit::big_dword;
  local_308 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)&boost::spirit::big_dword;
  local_300 = &local_310;
  local_2f8 = (MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> *)
              &boost::spirit::big_dword;
  local_2d0 = (rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::locals<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
               *)&boost::spirit::omit;
  local_290.members.bound_memfunc_ptr.memfunc_ptr =
       local_290.members.bound_memfunc_ptr.memfunc_ptr & 0xffffffff00000000;
  local_258._0_4_ = 0x10;
  local_330._8_8_ = local_148;
  local_320 = &local_290;
  local_318 = (MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> *)
              local_330;
  local_2f0 = &local_300;
  local_2e8 = (MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> *)
              &local_320;
  local_2c0._0_8_ = &boost::spirit::big_qword;
  local_2c0._8_8_ = &local_278;
  local_2c8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2c0;
  local_2e0 = (MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
               ******)&local_2f0;
  local_2d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)&local_2d0;
  local_2b0._0_8_ = &boost::spirit::big_qword;
  local_2b0._8_8_ = &boost::spirit::big_qword;
  local_2a0._0_8_ = &local_268;
  local_2a0._8_8_ = local_2c0 + 0x10;
  local_330._0_8_ =
       (MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> *)
       local_258;
  boost::spirit::qi::
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_lf::io::GMshFileV4::PeriodicLink_(),_boost::spirit::locals<unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::define<_2d0b82ea_>(local_1d8);
  _Var1._M_p = local_358;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffffc98,"periodic_link","");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (local_c8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &stack0xfffffffffffffc98);
  if (_Var1._M_p != local_358) {
    operator_delete(_Var1._M_p,local_358._0_8_ + 1);
  }
  local_358._8_8_ = *(undefined8 *)local_1d8;
  local_340.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<int,_std::allocator<int>_>,_boost::spirit::locals<unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<int,_std::allocator<int>_>,_boost::spirit::locals<unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::spirit::unused_type,_boost::spirit::unused_type>
          *)0x34063b;
  boost::
  function<bool_(__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<std::vector<lf::io::GMshFileV4::PeriodicLink,_std::allocator<lf::io::GMshFileV4::PeriodicLink>_>_&,_boost::fusion::nil_>,_boost::fusion::vector<unsigned_long>_>_&,_const_boost::spirit::unused_type_&)>
  ::
  operator=<boost::spirit::qi::detail::parser_binder<boost::spirit::qi::expect_operator<boost::fusion::cons<boost::spirit::qi::literal_string<const_char_(&)[11],_true>,_boost::fusion::cons<boost::spirit::qi::omit_directive<boost::spirit::qi::action<boost::spirit::qi::any_binary_parser<boost::spirit::qi::detail::integer<64>,_(boost::endian::order)0,_64>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::comma,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,_boost::proto::argsns_::list3<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::phoenix::stl::reserve>,_0L>,_boost::phoenix::actor<boost::spirit::attribute<0>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_3L>_>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::spirit::local_variable<0>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_>_>,_2L>_>_>_>,_boost::fusion::cons<boost::spirit::qi::lazy_directive<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,_boost::proto::argsns_::list2<boost::spirit::terminal<boost::spirit::tag::repeat>,_boost::phoenix::actor<boost::spirit::local_variable<0>_>_>,_2L>_>,_boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_lf::io::GMshFileV4::PeriodicLink_(),_boost::spirit::locals<unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>,_boost::spirit::unused_type>,_boost::fusion::cons<boost::spirit::qi::literal_string<const_char_(&)[14],_true>,_boost::fusion::nil_>_>_>_>_>,_mpl_::bool_<true>_>_>
            ((function<bool_(__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<std::vector<lf::io::GMshFileV4::PeriodicLink,_std::allocator<lf::io::GMshFileV4::PeriodicLink>_>_&,_boost::fusion::nil_>,_boost::fusion::vector<unsigned_long>_>_&,_const_boost::spirit::unused_type_&)>
              *)(this + 0x680),
             (parser_binder<boost::spirit::qi::expect_operator<boost::fusion::cons<boost::spirit::qi::literal_string<const_char_(&)[11],_true>,_boost::fusion::cons<boost::spirit::qi::omit_directive<boost::spirit::qi::action<boost::spirit::qi::any_binary_parser<boost::spirit::qi::detail::integer<64>,_(boost::endian::order)0,_64>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::comma,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,_boost::proto::argsns_::list3<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::phoenix::stl::reserve>,_0L>,_boost::phoenix::actor<boost::spirit::attribute<0>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_3L>_>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::spirit::local_variable<0>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_>_>,_2L>_>_>_>,_boost::fusion::cons<boost::spirit::qi::lazy_directive<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,_boost::proto::argsns_::list2<boost::spirit::terminal<boost::spirit::tag::repeat>,_boost::phoenix::actor<boost::spirit::local_variable<0>_>_>,_2L>_>,_boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_lf::io::GMshFileV4::PeriodicLink_(),_boost::spirit::locals<unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>,_boost::spirit::unused_type>,_boost::fusion::cons<boost::spirit::qi::literal_string<const_char_(&)[14],_true>,_boost::fusion::nil_>_>_>_>_>,_mpl_::bool_<true>_>
              *)&stack0xfffffffffffffc98);
  _Var1._M_p = local_358;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffffc98,"periodic_links","");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (local_d0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &stack0xfffffffffffffc98);
  if (_Var1._M_p != local_358) {
    operator_delete(_Var1._M_p,local_358._0_8_ + 1);
  }
  boost::
  function<bool_(__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<lf::io::GMshFileV4::GhostElement_&,_boost::fusion::nil_>,_boost::fusion::vector<unsigned_long>_>_&,_const_boost::spirit::unused_type_&)>
  ::operator=<_8076e570_>
            ((function<bool_(__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<lf::io::GMshFileV4::GhostElement_&,_boost::fusion::nil_>,_boost::fusion::vector<unsigned_long>_>_&,_const_boost::spirit::unused_type_&)>
              *)(this + 0x6c8),
             (parser_binder<boost::spirit::qi::expect_operator<boost::fusion::cons<boost::spirit::qi::any_binary_parser<boost::spirit::qi::detail::integer<64>,_(boost::endian::order)0,_64>,_boost::fusion::cons<boost::spirit::qi::any_binary_parser<boost::spirit::qi::detail::integer<32>,_(boost::endian::order)0,_32>,_boost::fusion::cons<boost::spirit::qi::omit_directive<boost::spirit::qi::action<boost::spirit::qi::any_binary_parser<boost::spirit::qi::detail::integer<64>,_(boost::endian::order)0,_64>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::comma,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,_boost::proto::argsns_::list3<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::phoenix::stl::reserve>,_0L>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::tag::at_c,_boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<mpl_::int_<2>_>,_0L>,_boost::phoenix::actor<boost::spirit::attribute<0>_>_>,_2L>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_3L>_>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::spirit::local_variable<0>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_>_>,_2L>_>_>_>,_boost::fusion::cons<boost::spirit::qi::lazy_directive<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,_boost::proto::argsns_::list2<boost::spirit::terminal<boost::spirit::tag::repeat>,_boost::phoenix::actor<boost::spirit::local_variable<0>_>_>,_2L>_>,_boost::spirit::qi::any_binary_parser<boost::spirit::qi::detail::integer<32>,_(boost::endian::order)0,_32>,_boost::spirit::unused_type>,_boost::fusion::nil_>_>_>_>_>,_mpl_::bool_<true>_>
              *)&stack0xfffffffffffffc98);
  _Var1._M_p = local_358;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffffc98,"ghost_element","");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (local_d8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &stack0xfffffffffffffc98);
  if (_Var1._M_p != local_358) {
    operator_delete(_Var1._M_p,local_358._0_8_ + 1);
  }
  local_358._8_8_ = *(undefined8 *)local_158;
  local_340.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<int,_std::allocator<int>_>,_boost::spirit::locals<unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<int,_std::allocator<int>_>,_boost::spirit::locals<unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::spirit::unused_type,_boost::spirit::unused_type>
          *)0x340659;
  boost::
  function<bool_(__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<std::vector<lf::io::GMshFileV4::GhostElement,_std::allocator<lf::io::GMshFileV4::GhostElement>_>_&,_boost::fusion::nil_>,_boost::fusion::vector<unsigned_long>_>_&,_const_boost::spirit::unused_type_&)>
  ::
  operator=<boost::spirit::qi::detail::parser_binder<boost::spirit::qi::expect_operator<boost::fusion::cons<boost::spirit::qi::literal_string<const_char_(&)[16],_true>,_boost::fusion::cons<boost::spirit::qi::omit_directive<boost::spirit::qi::action<boost::spirit::qi::any_binary_parser<boost::spirit::qi::detail::integer<64>,_(boost::endian::order)0,_64>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::comma,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,_boost::proto::argsns_::list3<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::phoenix::stl::reserve>,_0L>,_boost::phoenix::actor<boost::spirit::attribute<0>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_3L>_>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::spirit::local_variable<0>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_>_>,_2L>_>_>_>,_boost::fusion::cons<boost::spirit::qi::lazy_directive<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,_boost::proto::argsns_::list2<boost::spirit::terminal<boost::spirit::tag::repeat>,_boost::phoenix::actor<boost::spirit::local_variable<0>_>_>,_2L>_>,_boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_lf::io::GMshFileV4::GhostElement_(),_boost::spirit::locals<unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>,_boost::spirit::unused_type>,_boost::fusion::cons<boost::spirit::qi::literal_string<const_char_(&)[19],_true>,_boost::fusion::nil_>_>_>_>_>,_mpl_::bool_<true>_>_>
            ((function<bool_(__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<std::vector<lf::io::GMshFileV4::GhostElement,_std::allocator<lf::io::GMshFileV4::GhostElement>_>_&,_boost::fusion::nil_>,_boost::fusion::vector<unsigned_long>_>_&,_const_boost::spirit::unused_type_&)>
              *)(this + 0x710),
             (parser_binder<boost::spirit::qi::expect_operator<boost::fusion::cons<boost::spirit::qi::literal_string<const_char_(&)[16],_true>,_boost::fusion::cons<boost::spirit::qi::omit_directive<boost::spirit::qi::action<boost::spirit::qi::any_binary_parser<boost::spirit::qi::detail::integer<64>,_(boost::endian::order)0,_64>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::comma,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,_boost::proto::argsns_::list3<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::phoenix::stl::reserve>,_0L>,_boost::phoenix::actor<boost::spirit::attribute<0>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_3L>_>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::spirit::local_variable<0>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_>_>,_2L>_>_>_>,_boost::fusion::cons<boost::spirit::qi::lazy_directive<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,_boost::proto::argsns_::list2<boost::spirit::terminal<boost::spirit::tag::repeat>,_boost::phoenix::actor<boost::spirit::local_variable<0>_>_>,_2L>_>,_boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_lf::io::GMshFileV4::GhostElement_(),_boost::spirit::locals<unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>,_boost::spirit::unused_type>,_boost::fusion::cons<boost::spirit::qi::literal_string<const_char_(&)[19],_true>,_boost::fusion::nil_>_>_>_>_>,_mpl_::bool_<true>_>
              *)&stack0xfffffffffffffc98);
  _Var1._M_p = local_358;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffffc98,"ghost_elements","");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f3._19_8_,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xfffffffffffffc98);
  if (_Var1._M_p != local_358) {
    operator_delete(_Var1._M_p,local_358._0_8_ + 1);
  }
  local_2b0._0_8_ = local_130;
  local_2b0._8_8_ = &local_230;
  local_240.manager =
       (_func_void_function_buffer_ptr_function_buffer_ptr_functor_manager_operation_type *)
       (local_2c0 + 0x10);
  local_2a0._0_8_ = &local_268;
  local_2a0._8_8_ = &local_240;
  local_2c0._0_8_ = local_2a0;
  local_2d0 = (rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::locals<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
               *)local_2c0;
  local_2c8 = &local_200;
  local_290.members.obj_ptr = local_140;
  local_290._8_8_ = &local_170;
  local_210 = &local_290;
  local_330._0_8_ = &local_2d0;
  local_330._8_8_ = &local_210;
  local_320 = (function_buffer *)local_330;
  local_310 = &local_320;
  local_308 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)&local_180;
  local_300 = &local_310;
  local_2f0 = &local_300;
  local_2e8 = (MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> *)
              &local_1e0;
  local_258._0_8_ = local_150;
  local_258._8_8_ = &local_1f0;
  local_2e0 = (MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
               ******)&local_2f0;
  local_2d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)&local_1e8;
  local_278 = local_160;
  local_270 = (proto_child0 *)&local_188;
  local_218 = &local_278;
  local_268.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::locals<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(reference_wrapper<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::locals<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
          )local_1a0.t_;
  local_230.manager =
       (_func_void_function_buffer_ptr_function_buffer_ptr_functor_manager_operation_type *)
       local_1a0.t_;
  local_2c0._8_8_ = local_1b8;
  local_200._M_allocated_capacity = (size_type)local_1a0.t_;
  local_170 = local_1a0.t_;
  local_318 = local_1c8;
  local_180 = (function_buffer *)local_1a0.t_;
  local_2f8 = local_1d0;
  local_1e0 = local_1a0.t_;
  local_1f0.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::locals<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(reference_wrapper<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::locals<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
          )local_1a0.t_;
  local_188 = local_1a0.t_;
  local_1e8 = (MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> *)
              local_258;
  boost::spirit::qi::
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::fusion::adapted::MshFileV4Adapted_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::define<_989990b6_>(local_220);
  _Var1._M_p = local_358;
  std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xfffffffffffffc98,"entry","");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (local_a8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &stack0xfffffffffffffc98);
  if (_Var1._M_p != local_358) {
    operator_delete(_Var1._M_p,local_358._0_8_ + 1);
  }
  boost::spirit::qi::
  on_error<(boost::spirit::qi::error_handler_result)0,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::fusion::adapted::MshFileV4Adapted(),boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,boost::spirit::char_encoding::ascii>>,0l>,boost::spirit::unused_type,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,boost::proto::argsns_::list5<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<lf::io::(anonymous_namespace)::MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>::ErrorHandler>,0l>,boost::phoenix::actor<boost::spirit::argument<0>>,boost::phoenix::actor<boost::spirit::argument<1>>,boost::phoenix::actor<boost::spirit::argument<2>>,boost::phoenix::actor<boost::spirit::argument<3>>>,5l>>>
            (local_220,(expr_type)SUB85(_Var1._M_p,0));
  return;
}

Assistant:

explicit MshV4GrammarBinary(const DWORD& dword, const QWORD& qword,
                              const DOUBLE& bin_double)
      : MshV4GrammarBinary::base_type(entry_, "Msh File") {
    using phoenix::at_c;
    using phoenix::push_back;
    using phoenix::reserve;
    using phoenix::val;
    using qi::_val;
    using qi::attr;
    using qi::char_;
    using qi::eps;
    using qi::int_;
    using qi::lexeme;
    using qi::lit;
    using qi::omit;
    using qi::repeat;
    using qi::labels::_1;
    using qi::labels::_2;
    using qi::labels::_3;
    using qi::labels::_4;
    using qi::labels::_a;
    using qi::labels::_b;
    using qi::labels::_c;
    using qi::labels::_d;

    auto size_t_ = qi::ulong_long;

    // General Parsers:
    quoted_string_ %= lexeme['"' >> +(char_ - '"') >> '"'];
    quoted_string_.name("string");
    vec3_ %= bin_double > bin_double > bin_double;  // NOLINT
    vec3_.name("vec3");
    int_vec_ %= omit[qword[(reserve(_val, _1), _a = _1)]] > repeat(_a)[dword];
    int_vec_.name("int_vec");
    start_comment_ %= !lit("$PhysicalNames") >> !lit("$Entities") >>
                      !lit("$PartitionedEntities") >> !lit("$Nodes") >>
                      !lit("$Elements") >> !lit("$Periodic") >>
                      !lit("$GhostElements") >>
                      (lit('$') >> (+(char_ - qi::eol)));
    start_comment_.name("Start of Comment");
    comment_ %= start_comment_[_a = qi::_1] > *(char_ - '$') >> "$End" >>
                qi::string(_a);
    comment_.name("comment");
    qi::on_error<qi::fail>(comment_, error_handler_(_1, _2, _3, _4));

    // Physical names
    physical_name_ %= int_ > int_ > quoted_string_;  // NOLINT
    physical_name_.name("Physical Name");
    qi::on_error<qi::fail>(physical_name_, error_handler_(_1, _2, _3, _4));
    physical_name_vector_ %= "$PhysicalNames" >
                             omit[size_t_[(reserve(_val, _1), _a = _1)]] >
                             repeat(_a)[physical_name_] > "$EndPhysicalNames";
    physical_name_vector_.name("$PhysicalNames");

    // entities:
    point_entity_ %= dword > vec3_ > int_vec_;
    point_entity_.name("Point entity");

    entity_ %= dword > vec3_ > vec3_ > int_vec_ > int_vec_;
    entity_.name("entity");

    entities_ %= "$Entities\n" >
                 omit[qword[(reserve(phoenix::at_c<0>(_val), _1), _a = _1)]] >
                 omit[qword[(reserve(phoenix::at_c<1>(_val), _1), _b = _1)]] >
                 omit[qword[(reserve(phoenix::at_c<2>(_val), _1), _c = _1)]] >
                 omit[qword[(reserve(phoenix::at_c<3>(_val), _1), _d = _1)]] >
                 repeat(_a)[point_entity_] > repeat(_b)[entity_] >
                 repeat(_c)[entity_] > repeat(_d)[entity_] > "\n$EndEntities";
    entities_.name("$Entities");

    // PartitionedEntities
    ghost_entities_ %= omit[qword[(reserve(_val, _1), _a = _1)]] >
                       repeat(_a)[dword > dword];  // NOLINT
    ghost_entities_.name("ghost_entities");
    partitioned_point_entity_ %=
        dword > dword > dword > int_vec_ > vec3_ > int_vec_;  // NOLINT
    partitioned_point_entity_.name("partitioned_point_entity");

    // NOLINTNEXTLINE
    partitioned_entity_ %= dword > dword > dword > int_vec_ > vec3_ > vec3_ >
                           int_vec_ > int_vec_;  // NOLINT
    partitioned_entity_.name("partitioned_entity");

    partitioned_entities2_ %=
        omit[qword[(reserve(at_c<0>(_val), _1), _a = _1)]] >
        omit[qword[(reserve(at_c<1>(_val), _1), _b = _1)]] >
        omit[qword[(reserve(at_c<2>(_val), _1), _c = _1)]] >
        omit[qword[(reserve(at_c<3>(_val), _1), _d = _1)]] >
        repeat(_a)[partitioned_point_entity_] >
        repeat(_b)[partitioned_entity_] > repeat(_c)[partitioned_entity_] >
        repeat(_d)[partitioned_entity_];
    partitioned_entities2_.name("partitioned_entities2");

    partitioned_entities_ %= "$PartitionedEntities\n" > qword >
                             ghost_entities_ > partitioned_entities2_ >
                             "\n$EndPartitionedEntities";
    partitioned_entities_.name("partitioned_entities");

    // nodes:
    node_block_ %=
        dword > dword > dword >  // NOLINT
        omit[qword[(phoenix::resize(at_c<3>(_val), _1), _a = _1, _b = 0)]] >
        omit[repeat(_a)[qword[at_c<0>(at_c<3>(_val)[_b++]) = _1]]] >
        eps[_b = 0] >
        omit[repeat(_a)[vec3_[at_c<1>(at_c<3>(_val)[_b++]) = _1]]];
    node_block_.name("node_block");

    nodes_ %= "$Nodes\n" > omit[qword[(reserve(at_c<3>(_val), _1), _a = _1)]] >
              qword > qword > qword > repeat(_a)[node_block_] > "\n$EndNodes";
    nodes_.name("nodes");

    // elements:
    element_block_ %=
        dword > dword > dword >  // NOLINT
        omit[qword[(reserve(at_c<3>(_val), _1), _a = _1)]] >
        repeat(_a)[qword > repeat(numNodesAdapted(at_c<2>(_val)))[qword]];
    element_block_.name("element_block");

    elements_ %= "$Elements\n" >
                 omit[qword[(reserve(at_c<3>(_val), _1), _a = _1)]] > qword >
                 qword > qword > repeat(_a)[element_block_] > "\n$EndElements";
    elements_.name("elements");

    // periodic link
    // NOLINTNEXTLINE
    matrix4d_ %= bin_double > bin_double > bin_double > bin_double >
                 bin_double > bin_double > bin_double > bin_double >
                 bin_double > bin_double > bin_double > bin_double >
                 bin_double > bin_double > bin_double > bin_double;
    matrix4d_.name("matrix4d");

    // NOLINTNEXTLINE
    periodic_link_ %= dword > dword > dword >
                      (qword(0) | (qword(16) > matrix4d_)) >
                      omit[qword[(reserve(at_c<4>(_val), _1), _a = _1)]] >
                      repeat(_a)[qword > qword];  // NOLINT
    periodic_link_.name("periodic_link");

    periodic_links_ %= "$Periodic\n" >
                       omit[qword[(reserve(_val, _1), _a = _1)]] >
                       repeat(_a)[periodic_link_] > "\n$EndPeriodic";
    periodic_links_.name("periodic_links");

    // ghost elements:
    ghost_element_ %= qword > dword >
                      omit[qword[(reserve(at_c<2>(_val), _1), _a = _1)]] >
                      repeat(_a)[dword];
    ghost_element_.name("ghost_element");

    ghost_elements_ %= "$GhostElements\n" >
                       omit[qword[(reserve(_val, _1), _a = _1)]] >
                       repeat(_a)[ghost_element_] > "\n$EndGhostElements";
    ghost_elements_.name("ghost_elements");

    // The whole file
    entry_ %= *comment_ >> -(physical_name_vector_ >> *comment_) >> entities_ >>
              *comment_ >> -(partitioned_entities_ >> *comment_) >> nodes_ >>
              *comment_ >> elements_ >> *comment_ >>
              -(periodic_links_ >> *comment_) >>
              -(ghost_elements_ >> *comment_);
    entry_.name("entry");

    qi::on_error<qi::fail>(entry_, error_handler_(_1, _2, _3, _4));
  }